

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O0

void anon_unknown.dwarf_e9210::brotli_context::_compress
               (h2o_compress_context_t *self,h2o_iovec_t *inbufs,size_t inbufcnt,
               h2o_send_state_t state,h2o_iovec_t **outbufs,size_t *outbufcnt)

{
  int iVar1;
  size_t *outbufcnt_local;
  h2o_iovec_t **outbufs_local;
  h2o_send_state_t state_local;
  size_t inbufcnt_local;
  h2o_iovec_t *inbufs_local;
  h2o_compress_context_t *self_local;
  
  iVar1 = h2o_send_state_is_in_progress(state);
  _compress((brotli_context *)self,inbufs,inbufcnt,(uint)((iVar1 != 0 ^ 0xffU) & 1),outbufs,
            outbufcnt);
  return;
}

Assistant:

static void _compress(h2o_compress_context_t *self, h2o_iovec_t *inbufs, size_t inbufcnt, h2o_send_state_t state,
                              h2o_iovec_t **outbufs, size_t *outbufcnt) {
            static_cast<brotli_context*>(self)->_compress(inbufs, inbufcnt, !h2o_send_state_is_in_progress(state), outbufs, outbufcnt);
        }